

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

uint32_t recall_tree_ns::oas_predict(recall_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  undefined4 uVar1;
  undefined8 uVar2;
  node *pnVar3;
  node_pred **ppnVar4;
  long in_RCX;
  uint in_EDX;
  long in_RDI;
  float fVar5;
  node_pred *ls;
  float maxscore;
  uint32_t amaxscore;
  uint32_t save_pred;
  label_t mc;
  example *in_stack_ffffffffffffffa0;
  example *peVar6;
  example *ec_00;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar7;
  undefined8 in_stack_ffffffffffffffb8;
  example *peVar8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t local_30;
  
  uVar2 = *(undefined8 *)(in_RCX + 0x6828);
  uVar1 = *(undefined4 *)(in_RCX + 0x6850);
  local_30 = 0;
  add_node_id_feature((recall_tree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                      (example *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  *(undefined8 *)(in_RCX + 0x6828) = 0x7f7fffff;
  *(undefined4 *)(in_RCX + 0x6830) = 0;
  fVar5 = std::numeric_limits<float>::lowest();
  pnVar3 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_EDX);
  ppnVar4 = v_array<recall_tree_ns::node_pred>::begin(&pnVar3->preds);
  ec_00 = (example *)*ppnVar4;
  while( true ) {
    peVar6 = ec_00;
    pnVar3 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_EDX);
    ppnVar4 = v_array<recall_tree_ns::node_pred>::end(&pnVar3->preds);
    bVar7 = false;
    peVar8 = peVar6;
    if (ec_00 != (example *)*ppnVar4) {
      pnVar3 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_EDX);
      ppnVar4 = v_array<recall_tree_ns::node_pred>::begin(&pnVar3->preds);
      bVar7 = peVar6 < (example *)(*ppnVar4 + *(long *)(in_RDI + 0x30));
      in_stack_ffffffffffffffa0 = peVar6;
    }
    if (bVar7 == false) break;
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)CONCAT17(bVar7,in_stack_ffffffffffffffb0),ec_00,
               (size_t)in_stack_ffffffffffffffa0);
    if ((local_30 == 0) || (fVar5 < *(float *)(in_RCX + 0x68a8))) {
      fVar5 = *(float *)(in_RCX + 0x68a8);
      local_30 = *(uint32_t *)&(peVar8->super_example_predict).indices._begin;
    }
    ec_00 = (example *)&(peVar8->super_example_predict).indices.end_array;
  }
  remove_node_id_feature
            ((recall_tree *)(ulong)in_stack_ffffffffffffffb0,(uint32_t)((ulong)ec_00 >> 0x20),
             in_stack_ffffffffffffffa0);
  *(undefined8 *)(in_RCX + 0x6828) = uVar2;
  *(undefined4 *)(in_RCX + 0x6850) = uVar1;
  return local_30;
}

Assistant:

uint32_t oas_predict(recall_tree& b, single_learner& base, uint32_t cn, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  uint32_t amaxscore = 0;

  add_node_id_feature(b, cn, ec);
  ec.l.simple = {FLT_MAX, 0.f, 0.f};

  float maxscore = std::numeric_limits<float>::lowest();
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    base.predict(ec, b.max_routers + ls->label - 1);
    if (amaxscore == 0 || ec.partial_prediction > maxscore)
    {
      maxscore = ec.partial_prediction;
      amaxscore = ls->label;
    }
  }

  remove_node_id_feature(b, cn, ec);

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return amaxscore;
}